

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O1

void ** hash_GetNode(HashMapEntry **map,char *key)

{
  int iVar1;
  byte *pbVar2;
  byte bVar3;
  uint uVar4;
  HashMapEntry *pHVar5;
  
  bVar3 = *key;
  if (bVar3 == 0) {
    uVar4 = 0x811c9dc5;
  }
  else {
    pbVar2 = (byte *)(key + 1);
    uVar4 = 0x811c9dc5;
    do {
      uVar4 = (bVar3 ^ uVar4) * 0x1000193;
      bVar3 = *pbVar2;
      pbVar2 = pbVar2 + 1;
    } while (bVar3 != 0);
  }
  pHVar5 = map[uVar4 & 0xffff];
  if (pHVar5 != (HashMapEntry *)0x0) {
    do {
      if ((uVar4 >> 0x10 == (uint)pHVar5->hash) && (iVar1 = strcmp(pHVar5->key,key), iVar1 == 0)) {
        return &pHVar5->content;
      }
      pHVar5 = pHVar5->next;
    } while (pHVar5 != (HashMapEntry *)0x0);
  }
  return (void **)0x0;
}

Assistant:

void **hash_GetNode(HashMap const map, char const *key)
{
	HashType hashedKey = hash(key);
	struct HashMapEntry *ptr = map[(HalfHashType)hashedKey];

	while (ptr) {
		if (hashedKey >> HALF_HASH_NB_BITS == ptr->hash
		 && !strcmp(ptr->key, key)) {
			return &ptr->content;
		}
		ptr = ptr->next;
	}
	return NULL;
}